

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

void __thiscall slang::ast::UnrollVisitor::handle(UnrollVisitor *this,ForLoopStatement *loop)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  reference ppVVar4;
  EvalContext *this_00;
  ConstantValue *pCVar5;
  iterator ppCVar6;
  reference pCVar7;
  long in_RSI;
  byte *in_RDI;
  ConstantValue *local_res58;
  iterator __end3_2;
  iterator __begin3_2;
  SmallVector<slang::ConstantValue_*,_5UL> *__range3_2;
  size_t i;
  Expression *step;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3_1;
  ConstantValue *local;
  iterator __end3;
  iterator __begin3;
  SmallVector<slang::ConstantValue_*,_5UL> *__range3;
  ConstantValue cv_1;
  SmallVector<slang::ConstantValue,_16UL> values;
  ConstantValue cv;
  Expression *init;
  VariableSymbol *var;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *__range2;
  SmallVector<slang::ConstantValue_*,_5UL> localPtrs;
  anon_class_16_2_3f78c113 handleFail;
  span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *in_stack_fffffffffffffb68;
  EvalContext *in_stack_fffffffffffffb70;
  ConstantValue *this_01;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  undefined4 uVar8;
  uint in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb84;
  undefined1 in_stack_fffffffffffffb85;
  undefined1 in_stack_fffffffffffffb86;
  undefined1 in_stack_fffffffffffffb87;
  VariableSymbol *in_stack_fffffffffffffb90;
  ConstantValue *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  iterator local_430;
  ConstantValue *local_420;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_3e0;
  long local_3d8;
  ConstantValue *local_3d0;
  iterator local_3c8;
  iterator local_3c0;
  SmallVectorBase<slang::ConstantValue_*> *local_3b8;
  undefined1 local_3b0 [40];
  SmallVectorBase<slang::ConstantValue> local_388 [11];
  ConstantValue *local_c8;
  uint local_98;
  EvalContext *local_88;
  VariableSymbol *local_80;
  VariableSymbol **local_78;
  __normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
  local_70;
  long local_68;
  SmallVectorBase<slang::ConstantValue_*> local_60 [2];
  long local_20;
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)
                     0x873ee5);
  if ((((bVar1) || (*(long *)(local_10 + 0x40) == 0)) ||
      (bVar1 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::empty
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          0x873f09), bVar1)) || ((*in_RDI & 1) != 0)) {
    Statement::visit<slang::ast::UnrollVisitor&>
              ((Statement *)
               CONCAT17(in_stack_fffffffffffffb87,
                        CONCAT16(in_stack_fffffffffffffb86,
                                 CONCAT15(in_stack_fffffffffffffb85,
                                          CONCAT14(in_stack_fffffffffffffb84,
                                                   in_stack_fffffffffffffb80)))),
               (UnrollVisitor *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    return;
  }
  local_20 = local_10;
  SmallVector<slang::ConstantValue_*,_5UL>::SmallVector
            ((SmallVector<slang::ConstantValue_*,_5UL> *)0x873f5c);
  local_68 = local_10 + 0x30;
  local_70._M_current =
       (VariableSymbol **)
       std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffb68);
  local_78 = (VariableSymbol **)
             std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)
                        CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffb70,
                            (__normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffb68), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVVar4 = __gnu_cxx::
              __normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_70);
    local_80 = *ppVVar4;
    this_00 = (EvalContext *)ValueSymbol::getInitializer((ValueSymbol *)0x873fdf);
    local_88 = this_00;
    if (this_00 == (EvalContext *)0x0) {
      handle::anon_class_16_2_3f78c113::operator()
                ((anon_class_16_2_3f78c113 *)in_stack_fffffffffffffb90);
      local_98 = 1;
      goto LAB_008745d5;
    }
    Expression::eval((Expression *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     in_stack_fffffffffffffb70);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x874063);
    if (bVar1) {
      in_stack_fffffffffffffb90 = local_80;
      uVar2 = bVar1;
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)in_stack_fffffffffffffb70,
                 (ConstantValue *)in_stack_fffffffffffffb68);
      in_stack_fffffffffffffba0 =
           EvalContext::createLocal
                     (this_00,(ValueSymbol *)CONCAT17(uVar2,in_stack_fffffffffffffba8),
                      in_stack_fffffffffffffba0);
      local_c8 = in_stack_fffffffffffffba0;
      SmallVectorBase<slang::ConstantValue_*>::push_back
                ((SmallVectorBase<slang::ConstantValue_*> *)in_stack_fffffffffffffb70,
                 (ConstantValue **)in_stack_fffffffffffffb68);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x87412c);
    }
    else {
      handle::anon_class_16_2_3f78c113::operator()
                ((anon_class_16_2_3f78c113 *)in_stack_fffffffffffffb90);
    }
    local_98 = (uint)!bVar1;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x874144);
    if (local_98 != 0) goto LAB_008745d5;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::VariableSymbol_*const_*,_std::span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_70);
  }
  if ((in_RDI[1] & 1) == 0) {
    SmallVector<slang::ConstantValue,_16UL>::SmallVector
              ((SmallVector<slang::ConstantValue,_16UL> *)0x8741dc);
    do {
      uVar2 = UnrollVisitor::step((UnrollVisitor *)
                                  CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      if ((bool)uVar2) {
        Expression::eval((Expression *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)
                         ,in_stack_fffffffffffffb70);
      }
      else {
        memset(local_3b0,0,0x28);
        slang::ConstantValue::ConstantValue((ConstantValue *)0x87423f);
      }
      uVar3 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x87424c);
      if ((bool)uVar3) {
        in_stack_fffffffffffffb85 =
             slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffb70);
        if ((bool)in_stack_fffffffffffffb85) {
          local_3b8 = local_60;
          local_3c0 = SmallVectorBase<slang::ConstantValue_*>::begin(local_3b8);
          local_3c8 = SmallVectorBase<slang::ConstantValue_*>::end(local_3b8);
          for (; local_3c0 != local_3c8; local_3c0 = local_3c0 + 1) {
            local_3d0 = *local_3c0;
            SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue&>
                      ((SmallVectorBase<slang::ConstantValue> *)
                       CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                       (ConstantValue *)in_stack_fffffffffffffb70);
          }
          local_3d8 = local_10 + 0x48;
          local_3e0._M_current =
               (Expression **)
               std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          in_stack_fffffffffffffb68);
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
          while (bVar1 = __gnu_cxx::
                         operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                   ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                     *)in_stack_fffffffffffffb70,
                                    (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                     *)in_stack_fffffffffffffb68), ((bVar1 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::
            __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
            ::operator*(&local_3e0);
            Expression::eval((Expression *)
                             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                             in_stack_fffffffffffffb70);
            in_stack_fffffffffffffb84 =
                 slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x87440b);
            in_stack_fffffffffffffb80 =
                 CONCAT13(in_stack_fffffffffffffb84,(int3)in_stack_fffffffffffffb80) ^ 0xff000000;
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x874428);
            if ((in_stack_fffffffffffffb80 & 0x1000000) != 0) {
              handle::anon_class_16_2_3f78c113::operator()
                        ((anon_class_16_2_3f78c113 *)in_stack_fffffffffffffb90);
              local_98 = 1;
              goto LAB_00874490;
            }
            __gnu_cxx::
            __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
            ::operator++(&local_3e0);
          }
          local_98 = 0;
        }
        else {
          local_98 = 5;
        }
      }
      else {
        handle::anon_class_16_2_3f78c113::operator()
                  ((anon_class_16_2_3f78c113 *)in_stack_fffffffffffffb90);
        local_98 = 1;
      }
LAB_00874490:
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x87449d);
      if (local_98 != 0) goto LAB_008744ae;
      in_stack_fffffffffffffb7c = 0;
    } while( true );
  }
  Statement::visit<slang::ast::UnrollVisitor&>
            ((Statement *)
             CONCAT17(in_stack_fffffffffffffb87,
                      CONCAT16(in_stack_fffffffffffffb86,
                               CONCAT15(in_stack_fffffffffffffb85,
                                        CONCAT14(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                )))),
             (UnrollVisitor *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  local_98 = 1;
  goto LAB_008745d5;
LAB_008744ae:
  if (local_98 == 5) {
    local_420 = (ConstantValue *)0x0;
    uVar8 = 5;
    do {
      this_01 = local_420;
      pCVar5 = (ConstantValue *)SmallVectorBase<slang::ConstantValue>::size(local_388);
      if (pCVar5 <= this_01) {
        local_98 = 0;
        goto LAB_008745c8;
      }
      local_430 = SmallVectorBase<slang::ConstantValue_*>::begin(local_60);
      ppCVar6 = SmallVectorBase<slang::ConstantValue_*>::end(local_60);
      for (; local_430 != ppCVar6; local_430 = local_430 + 1) {
        pCVar7 = SmallVectorBase<slang::ConstantValue>::operator[](local_388,(size_type)local_420);
        slang::ConstantValue::operator=(this_01,pCVar7);
        local_420 = (ConstantValue *)
                    ((long)&(local_420->value).
                            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    + 1);
      }
      Statement::visit<slang::ast::UnrollVisitor&>
                ((Statement *)
                 CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffb85,
                                                        CONCAT14(in_stack_fffffffffffffb84,
                                                                 in_stack_fffffffffffffb80)))),
                 (UnrollVisitor *)CONCAT44(uVar8,in_stack_fffffffffffffb78));
    } while ((*in_RDI & 1) == 0);
    local_98 = 1;
  }
LAB_008745c8:
  SmallVector<slang::ConstantValue,_16UL>::~SmallVector
            ((SmallVector<slang::ConstantValue,_16UL> *)0x8745d5);
LAB_008745d5:
  SmallVector<slang::ConstantValue_*,_5UL>::~SmallVector
            ((SmallVector<slang::ConstantValue_*,_5UL> *)0x8745e2);
  return;
}

Assistant:

void handle(const ForLoopStatement& loop) {
        if (loop.loopVars.empty() || !loop.stopExpr || loop.steps.empty() || anyErrors) {
            loop.body.visit(*this);
            return;
        }

        // Attempt to unroll the loop. If we are unable to collect constant values
        // for all loop variables across all iterations, we won't unroll at all.
        auto handleFail = [&] {
            for (auto var : loop.loopVars)
                evalCtx.deleteLocal(var);
            loop.body.visit(*this);
        };

        SmallVector<ConstantValue*> localPtrs;
        for (auto var : loop.loopVars) {
            auto init = var->getInitializer();
            if (!init) {
                handleFail();
                return;
            }

            auto cv = init->eval(evalCtx);
            if (!cv) {
                handleFail();
                return;
            }

            localPtrs.push_back(evalCtx.createLocal(var, std::move(cv)));
        }

        // In setup mode we just do a single pass with our loop vars
        // defined to build the initial map of assignments.
        if (setupMode) {
            loop.body.visit(*this);
            return;
        }

        SmallVector<ConstantValue, 16> values;
        while (true) {
            auto cv = step() ? loop.stopExpr->eval(evalCtx) : ConstantValue();
            if (!cv) {
                handleFail();
                return;
            }

            if (!cv.isTrue())
                break;

            for (auto local : localPtrs)
                values.emplace_back(*local);

            for (auto step : loop.steps) {
                if (!step->eval(evalCtx)) {
                    handleFail();
                    return;
                }
            }
        }

        // We have all the loop iteration values. Go back through
        // and visit the loop body for each iteration.
        for (size_t i = 0; i < values.size();) {
            for (auto local : localPtrs)
                *local = std::move(values[i++]);

            loop.body.visit(*this);
            if (anyErrors)
                return;
        }
    }